

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void upsertDelete(sqlite3 *db,Upsert *p)

{
  sqlite3 *in_RSI;
  Upsert *pNext;
  sqlite3 *p_00;
  
  do {
    p_00 = (sqlite3 *)in_RSI->aDb;
    sqlite3ExprListDelete(in_RSI,(ExprList *)p_00);
    sqlite3ExprDelete(in_RSI,(Expr *)p_00);
    sqlite3ExprListDelete(in_RSI,(ExprList *)p_00);
    sqlite3ExprDelete(in_RSI,(Expr *)p_00);
    sqlite3DbFree(in_RSI,p_00);
    sqlite3DbFree(in_RSI,p_00);
    in_RSI = p_00;
  } while (p_00 != (sqlite3 *)0x0);
  return;
}

Assistant:

static void SQLITE_NOINLINE upsertDelete(sqlite3 *db, Upsert *p){
  do{
    Upsert *pNext = p->pNextUpsert;
    sqlite3ExprListDelete(db, p->pUpsertTarget);
    sqlite3ExprDelete(db, p->pUpsertTargetWhere);
    sqlite3ExprListDelete(db, p->pUpsertSet);
    sqlite3ExprDelete(db, p->pUpsertWhere);
    sqlite3DbFree(db, p->pToFree);
    sqlite3DbFree(db, p);
    p = pNext;
  }while( p );
}